

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O0

Client __thiscall capnp::MembranePolicy::importExternal(MembranePolicy *this,Client *external)

{
  Client *pCVar1;
  Client *in_RDX;
  ClientHook *extraout_RDX;
  Own<capnp::ClientHook,_std::nullptr_t> OVar2;
  Client CVar3;
  bool local_81;
  Own<capnp::MembranePolicy,_std::nullptr_t> local_80 [2];
  Client local_60;
  ClientHook local_50;
  Client *external_local;
  MembranePolicy *this_local;
  
  external_local = external;
  this_local = this;
  pCVar1 = kj::mv<capnp::Capability::Client>(in_RDX);
  Capability::Client::Client(&local_60,pCVar1);
  OVar2 = ClientHook::from(&local_50,&local_60);
  (*(code *)(external->hook).disposer[2]._vptr_Disposer)(local_80,external,OVar2.ptr);
  local_81 = true;
  kj::
  refcounted<capnp::MembraneHook,kj::Own<capnp::ClientHook,decltype(nullptr)>,kj::Own<capnp::MembranePolicy,decltype(nullptr)>,bool>
            ((kj *)&stack0xffffffffffffffc0,(Own<capnp::ClientHook,_std::nullptr_t> *)&local_50,
             local_80,&local_81);
  kj::Own<capnp::ClientHook,decltype(nullptr)>::Own<capnp::MembraneHook,void>
            ((Own<capnp::ClientHook,decltype(nullptr)> *)&stack0xffffffffffffffd0,
             (Own<capnp::MembraneHook,_std::nullptr_t> *)&stack0xffffffffffffffc0);
  Capability::Client::Client
            ((Client *)this,(Own<capnp::ClientHook,_std::nullptr_t> *)&stack0xffffffffffffffd0);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own
            ((Own<capnp::ClientHook,_std::nullptr_t> *)&stack0xffffffffffffffd0);
  kj::Own<capnp::MembraneHook,_std::nullptr_t>::~Own
            ((Own<capnp::MembraneHook,_std::nullptr_t> *)&stack0xffffffffffffffc0);
  kj::Own<capnp::MembranePolicy,_std::nullptr_t>::~Own(local_80);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own
            ((Own<capnp::ClientHook,_std::nullptr_t> *)&local_50);
  Capability::Client::~Client(&local_60);
  CVar3.hook.ptr = extraout_RDX;
  CVar3.hook.disposer = (Disposer *)this;
  return (Client)CVar3.hook;
}

Assistant:

Capability::Client MembranePolicy::importExternal(Capability::Client external) {
  return Capability::Client(kj::refcounted<MembraneHook>(
      ClientHook::from(kj::mv(external)), addRef(), true));
}